

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElimLeibniz.cpp
# Opt level: O2

Clause * __thiscall
Inferences::ElimLeibniz::createConclusion
          (ElimLeibniz *this,Clause *premise,Literal *newLit,Literal *posLit,Literal *negLit,
          RobSubstitution *subst)

{
  Literal *pLVar1;
  Literal **ppLVar2;
  Clause *pCVar3;
  uint uVar4;
  uint uVar5;
  RStack<Literal_*> resLits;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_98;
  Clause *local_88;
  Literal *local_80;
  RobSubstitution *local_78;
  GeneratingInference1 local_70;
  Inference local_60;
  
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_98);
  local_78 = subst;
  local_80 = Kernel::RobSubstitution::apply(subst,newLit,0);
  uVar4 = *(uint *)&premise->field_0x38 & 0xfffff;
  uVar5 = (uint)(uVar4 != 0);
  ppLVar2 = (Literal **)0x0;
  local_88 = premise;
  if (uVar4 != 0) {
    ppLVar2 = premise->_literals;
  }
  while (ppLVar2 != (Literal **)0x0) {
    pLVar1 = *ppLVar2;
    if (pLVar1 != negLit && pLVar1 != posLit) {
      pLVar1 = Kernel::RobSubstitution::apply(local_78,pLVar1,0);
      Lib::Stack<Kernel::Literal_*>::push
                ((Stack<Kernel::Literal_*> *)
                 local_98._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,pLVar1)
      ;
    }
    ppLVar2 = premise->_literals + (int)uVar5;
    if (uVar4 <= uVar5) {
      ppLVar2 = (Literal **)0x0;
    }
    uVar5 = uVar5 + (uVar5 < uVar4);
  }
  Lib::Stack<Kernel::Literal_*>::push
            ((Stack<Kernel::Literal_*> *)
             local_98._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
             .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,local_80);
  local_70.rule = LEIBNIZ_ELIMINATION;
  local_70.premise = local_88;
  Kernel::Inference::Inference(&local_60,&local_70);
  pCVar3 = Kernel::Clause::fromStack
                     ((Stack<Kernel::Literal_*> *)
                      local_98._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                      &local_60);
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_98);
  return pCVar3;
}

Assistant:

Clause* ElimLeibniz::createConclusion(Clause* premise, Literal* newLit, 
                                      Literal* posLit, Literal* negLit, RobSubstitution& subst){
  RStack<Literal*> resLits;
  Literal* newLitAfter = subst.apply(newLit, 0);

  for(Literal* curr : premise->iterLits()) {
    if(curr!=posLit && curr!=negLit){
      Literal* currAfter = subst.apply(curr, 0);
      resLits->push(currAfter);
    }
  }
  resLits->push(newLitAfter);
  return Clause::fromStack(*resLits, GeneratingInference1(InferenceRule::LEIBNIZ_ELIMINATION, premise));
}